

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_error.hpp
# Opt level: O2

string * __thiscall
jsoncons::json_error_category_impl::message_abi_cxx11_
          (string *__return_storage_ptr__,json_error_category_impl *this,int ev)

{
  char *__s;
  allocator<char> local_9;
  
  switch(ev) {
  case 1:
    __s = "Unexpected end of file";
    break;
  case 2:
    __s = "Source error";
    break;
  case 3:
    __s = "JSON syntax_error";
    break;
  case 4:
    __s = "Unexpected non-whitespace character after JSON text";
    break;
  case 5:
    __s = "Data item nesting exceeds limit in options";
    break;
  case 6:
    __s = "JSON strings cannot be quoted with single quotes";
    break;
  case 7:
    __s = "Illegal character in string";
    break;
  case 8:
    __s = "Extra comma";
    break;
  case 9:
    __s = "Expected object member key";
    break;
  case 10:
    __s = "Expected value";
    break;
  case 0xb:
    __s = "Invalid value";
    break;
  case 0xc:
    __s = "Expected name separator \':\'";
    break;
  case 0xd:
    __s = "Illegal control character in string";
    break;
  case 0xe:
    __s = "Illegal escaped character in string";
    break;
  case 0xf:
    __s = 
    "Invalid codepoint, expected another \\u token to begin the second half of a codepoint surrogate pair."
    ;
    break;
  case 0x10:
    __s = "Invalid codepoint, expected hexadecimal digit.";
    break;
  case 0x11:
    __s = "Invalid codepoint, expected four hexadecimal digits.";
    break;
  case 0x12:
    __s = "A number cannot have a leading zero";
    break;
  case 0x13:
    __s = "Invalid number";
    break;
  case 0x14:
    __s = "Expected comma or right brace \'}\'";
    break;
  case 0x15:
    __s = "Expected comma or right bracket \']\'";
    break;
  case 0x16:
    __s = "Unexpected right bracket \']\'";
    break;
  case 0x17:
    __s = "Unexpected right brace \'}\'";
    break;
  case 0x18:
    __s = "Illegal comment";
    break;
  case 0x19:
    __s = "Expected continuation byte";
    break;
  case 0x1a:
    __s = "Over long UTF-8 sequence";
    break;
  case 0x1b:
    __s = "Illegal codepoint (>= 0xd800 && <= 0xdfff)";
    break;
  case 0x1c:
    __s = "UTF-16 surrogate values are illegal in UTF-32";
    break;
  case 0x1d:
    __s = "Expected low surrogate following the high surrogate";
    break;
  case 0x1e:
    __s = "Illegal unicode character";
    break;
  default:
    __s = "Unknown JSON parser error";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const final
        {
            switch (static_cast<json_errc>(ev))
            {
                case json_errc::unexpected_eof:
                    return "Unexpected end of file";
                case json_errc::source_error:
                    return "Source error";
                case json_errc::syntax_error:
                    return "JSON syntax_error";
                case json_errc::extra_character:
                    return "Unexpected non-whitespace character after JSON text";
                case json_errc::max_nesting_depth_exceeded:
                    return "Data item nesting exceeds limit in options";
                case json_errc::single_quote:
                    return "JSON strings cannot be quoted with single quotes";
                case json_errc::illegal_character_in_string:
                    return "Illegal character in string";
                case json_errc::extra_comma:
                    return "Extra comma";
                case json_errc::expected_key:
                    return "Expected object member key";
                case json_errc::expected_value:
                    return "Expected value";
                case json_errc::invalid_value:
                    return "Invalid value";
                case json_errc::expected_colon:
                    return "Expected name separator ':'";
                case json_errc::illegal_control_character:
                    return "Illegal control character in string";
                case json_errc::illegal_escaped_character:
                    return "Illegal escaped character in string";
                case json_errc::expected_codepoint_surrogate_pair:
                    return "Invalid codepoint, expected another \\u token to begin the second half of a codepoint surrogate pair.";
                case json_errc::invalid_hex_escape_sequence:
                    return "Invalid codepoint, expected hexadecimal digit.";
                case json_errc::invalid_unicode_escape_sequence:
                    return "Invalid codepoint, expected four hexadecimal digits.";
                case json_errc::leading_zero:
                    return "A number cannot have a leading zero";
                case json_errc::invalid_number:
                    return "Invalid number";
                case json_errc::expected_comma_or_rbrace:
                    return "Expected comma or right brace '}'";
                case json_errc::expected_comma_or_rbracket:
                    return "Expected comma or right bracket ']'";
                case json_errc::unexpected_rbrace:
                    return "Unexpected right brace '}'";
                case json_errc::unexpected_rbracket:
                    return "Unexpected right bracket ']'";
                case json_errc::illegal_comment:
                    return "Illegal comment";
                case json_errc::expected_continuation_byte:
                    return "Expected continuation byte";
                case json_errc::over_long_utf8_sequence:
                    return "Over long UTF-8 sequence";
                case json_errc::illegal_codepoint:
                    return "Illegal codepoint (>= 0xd800 && <= 0xdfff)";
                case json_errc::illegal_surrogate_value:
                    return "UTF-16 surrogate values are illegal in UTF-32";
                case json_errc::unpaired_high_surrogate:
                    return "Expected low surrogate following the high surrogate";
                case json_errc::illegal_unicode_character:
                    return "Illegal unicode character";
                default:
                    return "Unknown JSON parser error";
                }
        }